

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O0

void __thiscall ScalarEstimator::estimate(ScalarEstimator *this,double d)

{
  int iVar1;
  double dVar2;
  int bin;
  double d_local;
  ScalarEstimator *this_local;
  
  (this->super_Estimator).nSamples = (this->super_Estimator).nSamples + 1;
  if (((this->super_Estimator).nEstimate & 1U) != 0) {
    this->dSample = d;
  }
  if (((this->super_Estimator).nEstimate & 4U) != 0) {
    this->dOne = d + this->dOne;
  }
  if (((this->super_Estimator).nEstimate & 8U) != 0) {
    this->dTwo = d * d + this->dTwo;
  }
  if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
    this->dThree = d * d * d + this->dThree;
  }
  if (((this->super_Estimator).nEstimate & 2U) != 0) {
    dVar2 = floor((d - this->dDistOffset) / this->dDistScale + 0.5);
    iVar1 = (int)dVar2;
    if ((iVar1 <= this->nDist) && (-1 < iVar1)) {
      this->aDist[iVar1] = this->aDist[iVar1] + 1.0;
    }
  }
  return;
}

Assistant:

void ScalarEstimator::estimate(double d)
{
	++nSamples;
	
	// record moments
	if(nEstimate & EST_SAMPLE)
		dSample = d;
	if(nEstimate & EST_MEAN)
		dOne += d;
	if(nEstimate & EST_VAR)
		dTwo += d*d;
	if(nEstimate & EST_CUR)
		dThree += d*d*d;

	// record density
	if(nEstimate & EST_DENS) {
		int bin = (int) floor( (d - dDistOffset) / dDistScale + 0.5); // round
		if( (bin <= nDist) && (bin >= 0) ) {
			aDist[ bin ]++;
		} else {
			;
		}
	}
}